

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::incoming_request(peer_connection *this,peer_request *r)

{
  pointer puVar1;
  byte bVar2;
  piece_index_t index;
  element_type *peVar3;
  pointer ppVar4;
  pointer ppVar5;
  element_type *peVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  undefined4 extraout_var;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  _Var15;
  undefined4 extraout_var_00;
  alert_manager *paVar16;
  undefined4 extraout_var_01;
  time_point tVar17;
  _List_node_base *p_Var18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool peer_interested;
  bool local_5a;
  bool local_59;
  shared_ptr<libtorrent::aux::torrent> t;
  uint local_38;
  int local_34;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_peer_connection_hot_members).m_torrent);
  peVar3 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  counters::inc_stats_counter(this->m_counters,0xf,1);
  uVar12 = (r->piece).m_val;
  if ((int)uVar12 < 0) {
    bVar10 = false;
  }
  else {
    bVar10 = (int)uVar12 <
             ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_num_pieces;
  }
  peer_log(this,incoming_message,"REQUEST","piece: %d s: %x l: %x",(ulong)uVar12,
           (ulong)(uint)r->start,(ulong)(uint)r->length);
  if (((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         field_0x5cc & 8) == 0) ||
      (iVar11 = (r->piece).m_val, (this->m_superseed_piece)._M_elems[0].m_val == iVar11)) ||
     ((this->m_superseed_piece)._M_elems[1].m_val == iVar11)) {
    if ((this->field_0x886 & 8) == 0) {
      incoming_have_none(this);
    }
    iVar11 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
    if ((char)iVar11 == '\0') {
      p_Var18 = (_List_node_base *)&this->m_extensions;
      do {
        p_Var18 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                     *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var18 == (_List_node_base *)&this->m_extensions) {
          iVar11 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
          if ((char)iVar11 != '\0') break;
          if (((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length < 1) {
            counters::inc_stats_counter(this->m_counters,0x11,1);
            peer_log(this,info,"INVALID_REQUEST","we don\'t have metadata yet");
          }
          else {
            ppVar4 = (this->m_requests).
                     super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     .
                     super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar5 = (this->m_requests).
                     super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     .
                     super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar11 = session_settings::get_int
                               ((this->super_peer_connection_hot_members).m_settings,0x4007);
            if ((int)(((long)ppVar4 - (long)ppVar5) / 0xc) <= iVar11) {
              _Var15 = ::std::
                       __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                                 ((this->m_accept_fast).
                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->m_accept_fast).
                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,r);
              local_38 = 0xffffffff;
              uVar12 = (uint)((ulong)((long)_Var15._M_current -
                                     (long)(this->m_accept_fast).
                                           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2);
              if (_Var15._M_current ==
                  (this->m_accept_fast).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar12 = local_38;
              }
              if ((this->field_0x887 & 2) == 0) {
                iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)
                           ._vptr_session_logger[5])();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar11) + 0x68) < 0) {
                  if (bVar10) {
                    uVar13 = file_storage::piece_size
                                       (&(((t.
                                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
                    uVar19 = (ulong)uVar13;
                  }
                  else {
                    uVar19 = 0xffffffffffffffff;
                  }
                  peVar6 = ((t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  uVar13 = (peVar6->m_files).m_piece_length;
                  uVar20 = 0x4000;
                  if (uVar13 < 0x4000) {
                    uVar20 = uVar13;
                  }
                  if ((int)uVar13 < 1) {
                    uVar20 = 0x4000;
                  }
                  peer_log(this,info,"INVALID_REQUEST",
                           "peer is not interested  t: %d n: %d block_limit: %d",uVar19,
                           (ulong)(uint)(peVar6->m_files).m_num_pieces,(ulong)uVar20);
                  peer_log(this,info,"INTERESTED","artificial incoming INTERESTED message");
                }
                paVar16 = torrent::alerts(t.
                                          super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr);
                if (((paVar16->m_alert_mask)._M_i.m_val & 2) != 0) {
                  paVar16 = torrent::alerts(t.
                                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
                  torrent::get_handle((torrent *)&stack0xffffffffffffffb8);
                  peer_interested =
                       torrent::has_piece_passed
                                 (t.
                                  super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(piece_index_t)(r->piece).m_val);
                  local_59 = false;
                  local_5a = false;
                  alert_manager::
                  emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool,bool>
                            (paVar16,(torrent_handle *)&stack0xffffffffffffffb8,&this->m_remote,
                             &this->m_peer_id,r,&peer_interested,&local_59,&local_5a);
                  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
                }
                incoming_interested(this);
              }
              index.m_val = (r->piece).m_val;
              if (((((-1 < index.m_val) &&
                    (index.m_val <
                     ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces)) &&
                   ((bVar9 = torrent::has_piece_passed
                                       (t.
                                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,index), bVar9 ||
                    ((bVar9 = torrent::is_predictive_piece
                                        (t.
                                         super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,(piece_index_t)(r->piece).m_val), bVar9 ||
                     (((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->field_0x5cc & 4) != 0)))))) && (iVar11 = r->start, -1 < iVar11)) &&
                 (((iVar14 = file_storage::piece_size
                                       (&peVar3->m_files,(piece_index_t)(r->piece).m_val),
                   iVar11 < iVar14 && (0 < r->length)) &&
                  (iVar11 = r->start, local_34 = r->length,
                  iVar14 = file_storage::piece_size
                                     (&peVar3->m_files,(piece_index_t)(r->piece).m_val),
                  iVar11 + local_34 <= iVar14)))) {
                uVar13 = ((((t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_files).m_piece_length;
                uVar20 = 0x4000;
                if (uVar13 < 0x4000) {
                  uVar20 = uVar13;
                }
                if ((int)uVar13 < 1) {
                  uVar20 = 0x4000;
                }
                if (r->length <= (int)uVar20) {
                  bVar2 = (this->super_peer_connection_hot_members).field_0x28;
                  if (uVar12 == 0xffffffff || (bVar2 & 0x20) == 0) {
                    if (uVar12 == 0xffffffff && (bVar2 & 0x20) != 0) {
                      peer_log(this,info,"REJECTING REQUEST",
                               "peer choked and piece not in allowed fast set");
                      counters::inc_stats_counter(this->m_counters,0x12,1);
                      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
                      tVar17 = time_now();
                      if ((long)(this->m_last_choke).m_time_diff.__r * 1000000 +
                          (this->m_connect).__d.__r < (long)tVar17.__d.__r + -2000000000) {
                        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                  ((error_code *)&stack0xffffffffffffffb8,
                                   too_many_requests_when_choked,(type *)0x0);
                        bVar10 = can_disconnect(this,(error_code *)&stack0xffffffffffffffb8);
                        if (bVar10) {
                          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                    ((error_code *)&stack0xffffffffffffffb8,
                                     too_many_requests_when_choked,(type *)0x0);
                          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                                    (this,(error_code *)&stack0xffffffffffffffb8,1,2);
                        }
                      }
                      break;
                    }
                    if (uVar12 != 0xffffffff) goto LAB_002247a5;
                  }
                  else {
                    if (((int)((peVar3->m_files).m_piece_length + uVar20 + -1) / (int)uVar20) * 3 <=
                        (int)(uint)(this->m_accept_fast_piece_cnt).
                                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar12]) {
                      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                ((error_code *)&stack0xffffffffffffffb8,
                                 too_many_requests_when_choked,(type *)0x0);
                      bVar10 = can_disconnect(this,(error_code *)&stack0xffffffffffffffb8);
                      if (bVar10) {
                        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                  ((error_code *)&stack0xffffffffffffffb8,
                                   too_many_requests_when_choked,(type *)0x0);
                        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                                  (this,(error_code *)&stack0xffffffffffffffb8,1,2);
                        break;
                      }
                    }
LAB_002247a5:
                    puVar1 = (this->m_accept_fast_piece_cnt).
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + (int)uVar12;
                    *puVar1 = *puVar1 + 1;
                  }
                  if ((this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    counters::inc_stats_counter(this->m_counters,0xed,1);
                  }
                  ::std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                  ::push_back(&(this->m_requests).
                               super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                              ,r);
                  paVar16 = torrent::alerts(t.
                                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr);
                  if (((paVar16->m_alert_mask)._M_i.m_val >> 0x10 & 1) != 0) {
                    paVar16 = torrent::alerts(t.
                                              super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
                    torrent::get_handle((torrent *)&stack0xffffffffffffffb8);
                    alert_manager::
                    emplace_alert<libtorrent::incoming_request_alert,libtorrent::peer_request_const&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&>
                              (paVar16,r,(torrent_handle *)&stack0xffffffffffffffb8,&this->m_remote,
                               &this->m_peer_id);
                    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0)
                    ;
                  }
                  lVar7 = (this->m_connect).__d.__r;
                  tVar17 = time_now();
                  (this->m_last_incoming_request).m_time_diff.__r =
                       (rep_conflict)(((long)tVar17.__d.__r - lVar7) / 1000000);
                  fill_send_buffer(this);
                  break;
                }
              }
              counters::inc_stats_counter(this->m_counters,0x11,1);
              iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])();
              if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar11) + 0x68) < 0) {
                bVar2 = this->field_0x887;
                if (bVar10) {
                  local_38 = file_storage::piece_size
                                       (&(((t.
                                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
                }
                uVar12 = (peVar3->m_files).m_num_pieces;
                bVar10 = torrent::has_piece_passed
                                   (t.
                                    super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(piece_index_t)(r->piece).m_val);
                uVar13 = ((((t.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_files).m_piece_length;
                uVar20 = 0x4000;
                if (uVar13 < 0x4000) {
                  uVar20 = uVar13;
                }
                if ((int)uVar13 < 1) {
                  uVar20 = 0x4000;
                }
                peer_log(this,info,"INVALID_REQUEST","i: %d t: %d n: %d h: %d block_limit: %d",
                         (ulong)(bVar2 >> 1 & 1),(ulong)local_38,(ulong)uVar12,(ulong)bVar10,
                         (ulong)uVar20);
              }
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
              if (this->m_num_invalid_requests != 0xffff) {
                this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
              }
              paVar16 = torrent::alerts(t.
                                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
              if (((paVar16->m_alert_mask)._M_i.m_val & 2) != 0) {
                peer_interested = (bool)((byte)this->field_0x887 >> 1 & 1);
                paVar16 = torrent::alerts(t.
                                          super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr);
                torrent::get_handle((torrent *)&stack0xffffffffffffffb8);
                local_59 = torrent::has_piece_passed
                                     (t.
                                      super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(piece_index_t)(r->piece).m_val);
                local_5a = false;
                alert_manager::
                emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                          (paVar16,(torrent_handle *)&stack0xffffffffffffffb8,&this->m_remote,
                           &this->m_peer_id,r,&local_59,&peer_interested,&local_5a);
                ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                          ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
              }
              if ((((this->field_0x887 & 2) != 0) || (this->m_num_invalid_requests % 10 != 0)) ||
                 (((this->super_peer_connection_hot_members).field_0x28 & 0x20) == 0)) break;
              if ((300 < this->m_num_invalid_requests) && (-1 < *(short *)&this->field_0x885)) {
                boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                          ((error_code *)&stack0xffffffffffffffb8,too_many_requests_when_choked,
                           (type *)0x0);
                bVar10 = can_disconnect(this,(error_code *)&stack0xffffffffffffffb8);
                if (bVar10) {
                  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                            ((error_code *)&stack0xffffffffffffffb8,too_many_requests_when_choked,
                             (type *)0x0);
                  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                            (this,(error_code *)&stack0xffffffffffffffb8,1,2);
                  break;
                }
              }
              peer_log(this,outgoing_message,"CHOKE");
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1f])(this);
              break;
            }
            counters::inc_stats_counter(this->m_counters,0x10,1);
            peer_log(this,info,"INVALID_REQUEST","incoming request queue full %d",
                     ((long)(this->m_requests).
                            super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                            .
                            super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_requests).
                           super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                           .
                           super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff);
          }
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
          break;
        }
        cVar8 = (**(code **)(*(long *)p_Var18[1]._M_next + 0x90))(p_Var18[1]._M_next,r);
      } while (cVar8 == '\0');
    }
  }
  else {
    counters::inc_stats_counter(this->m_counters,0x11,1);
    if (this->m_num_invalid_requests != 0xffff) {
      this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
    }
    iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar11) + 0x68) < 0) {
      bVar2 = this->field_0x887;
      peVar3 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar10) {
        uVar12 = file_storage::piece_size(&peVar3->m_files,(piece_index_t)(r->piece).m_val);
        uVar19 = (ulong)uVar12;
        uVar12 = ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_files).m_num_pieces;
        bVar10 = torrent::has_piece_passed
                           (t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(piece_index_t)(r->piece).m_val);
        uVar21 = (ulong)bVar10;
      }
      else {
        uVar19 = 0xffffffffffffffff;
        uVar12 = (peVar3->m_files).m_num_pieces;
        uVar21 = 0;
      }
      peer_log(this,info,"INVALID_REQUEST",
               "piece not super-seeded i: %d t: %d n: %d h: %d ss1: %d ss2: %d",
               (ulong)(bVar2 >> 1 & 1),uVar19 & 0xffffffff,(ulong)uVar12,uVar21,
               (ulong)(uint)(this->m_superseed_piece)._M_elems[0].m_val,
               (ulong)(uint)(this->m_superseed_piece)._M_elems[1].m_val);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
    paVar16 = torrent::alerts(t.
                              super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if (((paVar16->m_alert_mask)._M_i.m_val & 2) != 0) {
      peer_interested = (bool)((byte)this->field_0x887 >> 1 & 1);
      paVar16 = torrent::alerts(t.
                                super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      torrent::get_handle((torrent *)&stack0xffffffffffffffb8);
      local_59 = torrent::has_piece_passed
                           (t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(piece_index_t)(r->piece).m_val);
      local_5a = true;
      alert_manager::
      emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                (paVar16,(torrent_handle *)&stack0xffffffffffffffb8,&this->m_remote,&this->m_peer_id
                 ,r,&local_59,&peer_interested,&local_5a);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::incoming_request(peer_request const& r)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
		torrent_info const& ti = t->torrent_file();

		m_counters.inc_stats_counter(counters::piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
		const bool valid_piece_index
			= r.piece >= piece_index_t(0)
			&& r.piece < t->torrent_file().end_piece();

		peer_log(peer_log_alert::incoming_message, "REQUEST"
			, "piece: %d s: %x l: %x", static_cast<int>(r.piece), r.start, r.length);
#endif

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& !super_seeded_piece(r.piece))
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "piece not super-seeded "
					"i: %d t: %d n: %d h: %d ss1: %d ss2: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, valid_piece_index ? t->has_piece_passed(r.piece) : 0
					, static_cast<int>(m_superseed_piece[0])
					, static_cast<int>(m_superseed_piece[1]));
			}
#endif

			write_reject_request(r);

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, true);
			}
			return;
		}
#endif // TORRENT_DISABLE_SUPERSEEDING

		// if we haven't received a bitfield, it was
		// probably omitted, which is the same as 'have_none'
		if (!m_bitfield_received) incoming_have_none();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_request(r)) return;
		}
		if (is_disconnecting()) return;
#endif

		if (!t->valid_metadata())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			// if we don't have valid metadata yet,
			// we shouldn't get a request
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "we don't have metadata yet");
#endif
			write_reject_request(r);
			return;
		}

		if (int(m_requests.size()) > m_settings.get_int(settings_pack::max_allowed_in_request_queue))
		{
			m_counters.inc_stats_counter(counters::max_piece_requests);
			// don't allow clients to abuse our
			// memory consumption.
			// ignore requests if the client
			// is making too many of them.
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "incoming request queue full %d"
				, int(m_requests.size()));
#endif
			write_reject_request(r);
			return;
		}

		int fast_idx = -1;
		auto const fast_iter = std::find(m_accept_fast.begin()
			, m_accept_fast.end(), r.piece);
		if (fast_iter != m_accept_fast.end()) fast_idx = int(fast_iter - m_accept_fast.begin());

		if (!m_peer_interested)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "peer is not interested "
					" t: %d n: %d block_limit: %d"
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, t->block_size());
				peer_log(peer_log_alert::info, "INTERESTED", "artificial incoming INTERESTED message");
			}
#endif
			if (t->alerts().should_post<invalid_request_alert>())
			{
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece)
					, false, false);
			}

			// be lenient and pretend that the peer said it was interested
			incoming_interested();
		}

		// make sure this request
		// is legal and that the peer
		// is not choked
		if (r.piece < piece_index_t(0)
			|| r.piece >= t->torrent_file().end_piece()
			|| (!t->has_piece_passed(r.piece)
#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
				&& !t->is_predictive_piece(r.piece)
#endif
				&& !t->seed_mode())
			|| r.start < 0
			|| r.start >= ti.piece_size(r.piece)
			|| r.length <= 0
			|| r.length + r.start > ti.piece_size(r.piece)
			|| r.length > t->block_size())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST"
					, "i: %d t: %d n: %d h: %d block_limit: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, ti.num_pieces()
					, t->has_piece_passed(r.piece)
					, t->block_size());
			}
#endif

			write_reject_request(r);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, false);
			}

			// every ten invalid request, remind the peer that it's choked
			if (!m_peer_interested && m_num_invalid_requests % 10 == 0 && m_choked)
			{
				// TODO: 2 this should probably be based on time instead of number
				// of request messages. For a very high throughput connection, 300
				// may be a legitimate number of requests to have in flight when
				// getting choked
				if (m_num_invalid_requests > 300 && !m_peer_choked
					&& can_disconnect(errors::too_many_requests_when_choked))
				{
					disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
					return;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::outgoing_message, "CHOKE");
#endif
				write_choke();
			}

			return;
		}

		// if we have choked the client
		// ignore the request
		int const blocks_per_piece =
			(ti.piece_length() + t->block_size() - 1) / t->block_size();

		// disconnect peers that downloads more than foo times an allowed
		// fast piece
		if (m_choked && fast_idx != -1 && m_accept_fast_piece_cnt[fast_idx] >= 3 * blocks_per_piece
			&& can_disconnect(errors::too_many_requests_when_choked))
		{
			disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_choked && fast_idx == -1)
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "REJECTING REQUEST", "peer choked and piece not in allowed fast set");
#endif
			m_counters.inc_stats_counter(counters::choked_piece_requests);
			write_reject_request(r);

			// allow peers to send request up to 2 seconds after getting choked,
			// then disconnect them
			if (aux::time_now() - seconds(2) > m_last_choke.get(m_connect)
				&& can_disconnect(errors::too_many_requests_when_choked))
			{
				disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
				return;
			}
		}
		else
		{
			// increase the allowed fast set counter
			if (fast_idx != -1)
				++m_accept_fast_piece_cnt[fast_idx];

			if (m_requests.empty())
				m_counters.inc_stats_counter(counters::num_peers_up_requests);

			TORRENT_ASSERT(t->valid_metadata());
			TORRENT_ASSERT(r.piece >= piece_index_t(0));
			TORRENT_ASSERT(r.piece < t->torrent_file().end_piece());
			TORRENT_ASSERT(r.length <= default_block_size);
			TORRENT_ASSERT(r.length > 0);

			m_requests.push_back(r);

			if (t->alerts().should_post<incoming_request_alert>())
			{
				t->alerts().emplace_alert<incoming_request_alert>(r, t->get_handle()
					, m_remote, m_peer_id);
			}

			m_last_incoming_request.set(m_connect, aux::time_now());
			fill_send_buffer();
		}
	}